

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O1

bool __thiscall
axl::sl::Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::
setCountImpl<axl::sl::SimpleArrayDetails<unsigned_long>::ZeroConstruct>
          (Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *this,size_t count)

{
  int32_t *piVar1;
  ulong uVar2;
  Hdr *pHVar3;
  FreeFunc *pFVar4;
  BufHdr *pBVar5;
  size_t sVar6;
  EVP_PKEY_CTX *dst;
  size_t sVar7;
  unsigned_long *puVar8;
  Hdr *pHVar9;
  bool bVar10;
  Ptr<axl::rc::BufHdr> hdr;
  Ptr<axl::rc::BufHdr> local_38;
  
  sVar7 = count * 8;
  pHVar9 = (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_hdr;
  if ((pHVar9 == (Hdr *)0x0) || ((pHVar9->super_RefCount).m_refCount != 1)) {
LAB_00107f4f:
    if (count == 0) {
      ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::release
                (&this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>);
      return true;
    }
    if ((this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count != 0) {
      sVar6 = getAllocSize<4096ul>(sVar7);
      dst = (EVP_PKEY_CTX *)operator_new(sVar6 + 0x28,(nothrow_t *)&std::nothrow);
      *(undefined4 *)(dst + 0x10) = 0;
      *(undefined4 *)(dst + 0x14) = 1;
      *(undefined ***)dst = &PTR__RefCount_0014c0a0;
      *(size_t *)(dst + 0x18) = sVar6;
      *(undefined8 *)(dst + 0x20) = 0;
      *(code **)(dst + 8) = mem::deallocate;
      local_38.m_p = (Hdr *)0x0;
      local_38.m_refCount = (RefCount *)0x0;
      rc::Ptr<axl::rc::BufHdr>::copy(&local_38,dst,dst);
      bVar10 = local_38.m_p != (Hdr *)0x0;
      if (bVar10) {
        pHVar9 = local_38.m_p + 1;
        puVar8 = (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_p;
        uVar2 = (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count
        ;
        if (uVar2 < count) {
          __wrap_memcpy(pHVar9,puVar8,uVar2 << 3);
          sVar7 = (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).
                  m_count;
          memset(&(pHVar9->super_RefCount)._vptr_RefCount + sVar7,0,(count - sVar7) * 8);
        }
        else {
          __wrap_memcpy(pHVar9,puVar8,sVar7);
        }
        pHVar3 = (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_hdr;
        LOCK();
        piVar1 = &(pHVar3->super_RefCount).m_refCount;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          (**(pHVar3->super_RefCount)._vptr_RefCount)(pHVar3);
          LOCK();
          piVar1 = &(pHVar3->super_RefCount).m_weakRefCount;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) &&
             (pFVar4 = (pHVar3->super_RefCount).m_freeFunc, pFVar4 != (FreeFunc *)0x0)) {
            (*pFVar4)(pHVar3);
          }
        }
        pBVar5 = local_38.m_p;
        (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_p =
             (unsigned_long *)pHVar9;
        local_38.m_p = (Hdr *)0x0;
        local_38.m_refCount = (RefCount *)0x0;
        (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_hdr = pBVar5;
        (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count = count
        ;
      }
      rc::Ptr<axl::rc::BufHdr>::clear(&local_38);
      return bVar10;
    }
    bVar10 = reserve(this,count);
    if (!bVar10) {
      return bVar10;
    }
    puVar8 = (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_p;
  }
  else {
    uVar2 = (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count;
    bVar10 = true;
    if (count == uVar2) {
      return true;
    }
    if (pHVar9->m_bufferSize < sVar7) goto LAB_00107f4f;
    if (count < uVar2 || count - uVar2 == 0) goto LAB_001080a6;
    puVar8 = (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_p +
             uVar2;
    sVar7 = (count - uVar2) * 8;
  }
  memset(puVar8,0,sVar7);
LAB_001080a6:
  (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count = count;
  return bVar10;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}